

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

void __thiscall
ear::Layout::Layout(Layout *this,string *name,
                   vector<ear::Channel,_std::allocator<ear::Channel>_> *channels,
                   optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> *screen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pCVar5;
  
  paVar1 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_name).field_2 + 8) = uVar4;
  }
  else {
    (this->_name)._M_dataplus._M_p = pcVar3;
    (this->_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  pCVar5 = (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start =
       (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar5;
  (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (channels->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_screen).super_type.m_initialized = false;
  if ((screen->super_type).m_initialized == true) {
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::variant
              ((variant<ear::PolarScreen,_ear::CartesianScreen> *)
               &(this->_screen).super_type.m_storage,
               (variant<ear::PolarScreen,_ear::CartesianScreen> *)&(screen->super_type).m_storage);
    (this->_screen).super_type.m_initialized = true;
  }
  return;
}

Assistant:

Layout::Layout(std::string name, std::vector<Channel> channels,
                 boost::optional<Screen> screen)
      : _name(std::move(name)),
        _channels(std::move(channels)),
        _screen(screen){}